

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# readoldpsm.c
# Opt level: O0

DUMB_IT_SIGDATA * it_old_psm_load_sigdata(DUMBFILE *f)

{
  char cVar1;
  int32 iVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  DUMB_IT_SIGDATA *__ptr;
  uchar *puVar9;
  IT_SAMPLE *pIVar10;
  IT_PATTERN *pIVar11;
  void *__base;
  DUMBFILE *in_RDI;
  undefined4 unaff_retaddr;
  int unaff_retaddr_00;
  int in_stack_00000008;
  int in_stack_0000000c;
  int o;
  int sep;
  int total_pattern_size;
  int n_channels;
  int n_orders;
  int pver;
  int version;
  int flags;
  int n;
  int n_components;
  PSM_COMPONENT *component;
  DUMB_IT_SIGDATA *sigdata;
  DUMBFILE *in_stack_ffffffffffffffa8;
  DUMBFILE *in_stack_ffffffffffffffb0;
  int in_stack_ffffffffffffffb8;
  int in_stack_ffffffffffffffbc;
  int32 in_stack_ffffffffffffffc0;
  int32 in_stack_ffffffffffffffc4;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  int local_28;
  int local_24;
  int *in_stack_fffffffffffffff8;
  
  local_24 = 0;
  iVar2 = dumbfile_mgetl(in_stack_ffffffffffffffa8);
  if ((iVar2 == 0x50534dfe) &&
     (__ptr = (DUMB_IT_SIGDATA *)malloc(0x138), __ptr != (DUMB_IT_SIGDATA *)0x0)) {
    iVar2 = dumbfile_getnc((char *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                           in_stack_ffffffffffffffc4,
                           (DUMBFILE *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8)
                          );
    if ((0x3b < iVar2) && (__ptr->name[0x3b] == '\x1a')) {
      __ptr->name[0x3b] = '\0';
      uVar3 = dumbfile_getc(in_stack_ffffffffffffffa8);
      iVar4 = dumbfile_getc(in_stack_ffffffffffffffa8);
      iVar5 = dumbfile_getc(in_stack_ffffffffffffffa8);
      iVar6 = dumbfile_getc(in_stack_ffffffffffffffa8);
      __ptr->speed = iVar6;
      iVar6 = dumbfile_getc(in_stack_ffffffffffffffa8);
      __ptr->tempo = iVar6;
      iVar6 = dumbfile_getc(in_stack_ffffffffffffffa8);
      __ptr->mixing_volume = iVar6;
      iVar6 = dumbfile_igetw(in_stack_ffffffffffffffa8);
      __ptr->n_orders = iVar6;
      iVar7 = dumbfile_igetw(in_stack_ffffffffffffffa8);
      iVar6 = dumbfile_igetw(in_stack_ffffffffffffffa8);
      __ptr->n_patterns = iVar6;
      iVar6 = dumbfile_igetw(in_stack_ffffffffffffffa8);
      __ptr->n_samples = iVar6;
      iVar6 = dumbfile_igetw(in_stack_ffffffffffffffa8);
      __ptr->n_pchannels = iVar6;
      iVar6 = dumbfile_igetw(in_stack_ffffffffffffffa8);
      iVar8 = dumbfile_error(in_RDI);
      if ((((iVar8 == 0) && ((uVar3 & 1) == 0)) && ((iVar4 == 1 || (iVar4 == 0x10)))) &&
         (((((((iVar5 == 0 && (0 < __ptr->n_orders)) && (__ptr->n_orders < 0x100)) &&
             ((iVar7 < 0x100 && (__ptr->n_orders <= iVar7)))) &&
            ((__ptr->n_patterns < 0x100 &&
             ((__ptr->n_samples < 0x100 && (__ptr->n_pchannels < 0x41)))))) &&
           (__ptr->n_pchannels <= iVar6)) && (iVar6 < 0x41)))) {
        __ptr->flags = 0x31;
        __ptr->global_volume = 0x80;
        __ptr->pan_separation = 0x80;
        __ptr->song_message = (uchar *)0x0;
        __ptr->order = (uchar *)0x0;
        __ptr->instrument = (IT_INSTRUMENT *)0x0;
        __ptr->sample = (IT_SAMPLE *)0x0;
        __ptr->pattern = (IT_PATTERN *)0x0;
        __ptr->midi = (IT_MIDI *)0x0;
        __ptr->checkpoint = (IT_CHECKPOINT *)0x0;
        __ptr->n_instruments = 0;
        __ptr->restart_position = '\0';
        puVar9 = (uchar *)malloc((long)__ptr->n_orders);
        __ptr->order = puVar9;
        if (__ptr->order != (uchar *)0x0) {
          if (__ptr->n_samples != 0) {
            pIVar10 = (IT_SAMPLE *)malloc((long)__ptr->n_samples * 0x68);
            __ptr->sample = pIVar10;
            if (__ptr->sample == (IT_SAMPLE *)0x0) goto LAB_009a36b4;
            for (local_28 = 0; local_28 < __ptr->n_samples; local_28 = local_28 + 1) {
              __ptr->sample[local_28].data = (void *)0x0;
            }
          }
          if (__ptr->n_patterns != 0) {
            pIVar11 = (IT_PATTERN *)malloc((long)__ptr->n_patterns << 4);
            __ptr->pattern = pIVar11;
            if (__ptr->pattern == (IT_PATTERN *)0x0) goto LAB_009a36b4;
            for (local_28 = 0; local_28 < __ptr->n_patterns; local_28 = local_28 + 1) {
              __ptr->pattern[local_28].entry = (IT_ENTRY *)0x0;
            }
          }
          __base = malloc(0x28);
          if (__base != (void *)0x0) {
            for (local_28 = 0; local_28 < 5; local_28 = local_28 + 1) {
              iVar2 = dumbfile_igetl(in_stack_ffffffffffffffa8);
              *(int32 *)((long)__base + (long)local_24 * 8 + 4) = iVar2;
              if (*(int *)((long)__base + (long)local_24 * 8 + 4) != 0) {
                *(char *)((long)__base + (long)local_24 * 8) = (char)local_28;
                local_24 = local_24 + 1;
              }
            }
            if ((local_24 != 0) &&
               (in_stack_ffffffffffffffc0 = dumbfile_igetl(in_stack_ffffffffffffffa8),
               in_stack_ffffffffffffffc0 != 0)) {
              qsort(__base,(long)local_24,8,psm_component_compare);
              memset(__ptr->channel_volume,0x40,0x40);
              for (local_28 = 0; local_28 < 0x40; local_28 = local_28 + 4) {
                in_stack_ffffffffffffffbc = (dumb_it_default_panning_separation << 5) / 100;
                cVar1 = (char)in_stack_ffffffffffffffbc;
                __ptr->channel_pan[local_28] = ' ' - cVar1;
                __ptr->channel_pan[local_28 + 1] = cVar1 + ' ';
                __ptr->channel_pan[local_28 + 2] = cVar1 + ' ';
                __ptr->channel_pan[local_28 + 3] = ' ' - cVar1;
              }
              local_28 = 0;
              do {
                if (local_24 <= local_28) {
                  _dumb_it_fix_invalid_orders
                            ((DUMB_IT_SIGDATA *)
                             CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
                  free(__base);
                  return __ptr;
                }
                iVar4 = dumbfile_seek(in_stack_ffffffffffffffb0,(long)in_stack_ffffffffffffffa8,0);
                if (iVar4 != 0) break;
                in_stack_ffffffffffffffb0 =
                     (DUMBFILE *)(ulong)*(byte *)((long)__base + (long)local_28 * 8);
                switch(in_stack_ffffffffffffffb0) {
                case (DUMBFILE *)0x0:
                  iVar2 = dumbfile_getnc((char *)CONCAT44(iVar5,iVar7),iVar6,
                                         (DUMBFILE *)
                                         CONCAT44(in_stack_ffffffffffffffbc,
                                                  in_stack_ffffffffffffffb8));
                  if ((__ptr->n_orders <= iVar2) &&
                     ((iVar7 <= __ptr->n_orders ||
                      (iVar4 = dumbfile_skip((DUMBFILE *)
                                             CONCAT44(in_stack_ffffffffffffffbc,
                                                      in_stack_ffffffffffffffb8),
                                             (long)in_stack_ffffffffffffffb0), iVar4 == 0)))) {
                    iVar4 = dumbfile_igetw(in_stack_ffffffffffffffa8);
                    goto joined_r0x009a35f9;
                  }
                  goto LAB_009a36aa;
                case (DUMBFILE *)0x1:
                  iVar2 = dumbfile_getnc((char *)CONCAT44(iVar5,iVar7),iVar6,
                                         (DUMBFILE *)
                                         CONCAT44(in_stack_ffffffffffffffbc,
                                                  in_stack_ffffffffffffffb8));
                  if (iVar2 < __ptr->n_pchannels) goto LAB_009a36aa;
                  for (in_stack_ffffffffffffffb8 = 0; in_stack_ffffffffffffffb8 < __ptr->n_pchannels
                      ; in_stack_ffffffffffffffb8 = in_stack_ffffffffffffffb8 + 1) {
                    __ptr->channel_pan[in_stack_ffffffffffffffb8] =
                         __ptr->channel_pan[in_stack_ffffffffffffffb8] -
                         (char)((int)(__ptr->channel_pan[in_stack_ffffffffffffffb8] & 8) >> 3);
                    __ptr->channel_pan[in_stack_ffffffffffffffb8] =
                         (uchar)((ulong)(long)(int)((uint)__ptr->channel_pan
                                                          [in_stack_ffffffffffffffb8] << 5) / 7);
                  }
                  break;
                case (DUMBFILE *)0x2:
                  iVar4 = it_old_psm_read_patterns
                                    (_total_pattern_size,_o,in_stack_0000000c,in_stack_00000008,
                                     unaff_retaddr_00);
                  goto joined_r0x009a35f9;
                case (DUMBFILE *)0x3:
                  iVar4 = it_old_psm_read_samples
                                    ((IT_SAMPLE **)CONCAT44(in_stack_0000000c,in_stack_00000008),
                                     (DUMBFILE *)CONCAT44(unaff_retaddr_00,unaff_retaddr),
                                     in_stack_fffffffffffffff8);
joined_r0x009a35f9:
                  if (iVar4 != 0) goto LAB_009a36aa;
                  break;
                case (DUMBFILE *)0x4:
                  iVar2 = dumbfile_mgetl(in_stack_ffffffffffffffa8);
                  if ((iVar2 == 0x54455854) &&
                     (in_stack_ffffffffffffffb8 = dumbfile_igetw(in_stack_ffffffffffffffa8),
                     0 < in_stack_ffffffffffffffb8)) {
                    puVar9 = (uchar *)malloc((long)(in_stack_ffffffffffffffb8 + 1));
                    __ptr->song_message = puVar9;
                    iVar2 = dumbfile_getnc((char *)CONCAT44(iVar5,iVar7),iVar6,
                                           (DUMBFILE *)
                                           CONCAT44(in_stack_ffffffffffffffbc,
                                                    in_stack_ffffffffffffffb8));
                    if (iVar2 < in_stack_ffffffffffffffb8) goto LAB_009a36aa;
                    __ptr->song_message[in_stack_ffffffffffffffb8] = '\0';
                  }
                }
                local_28 = local_28 + 1;
              } while( true );
            }
LAB_009a36aa:
            free(__base);
          }
        }
LAB_009a36b4:
        _dumb_it_unload_sigdata((sigdata_t *)CONCAT44(iVar6,in_stack_ffffffffffffffc0));
        return (DUMB_IT_SIGDATA *)0x0;
      }
    }
    free(__ptr);
  }
  return (DUMB_IT_SIGDATA *)0x0;
}

Assistant:

static DUMB_IT_SIGDATA *it_old_psm_load_sigdata(DUMBFILE *f)
{
	DUMB_IT_SIGDATA *sigdata;

	PSM_COMPONENT *component;
	int n_components = 0;

	int n, flags, version, pver, n_orders, n_channels, total_pattern_size;

	if (dumbfile_mgetl(f) != DUMB_ID('P','S','M',254)) goto error;

	sigdata = malloc(sizeof(*sigdata));
	if (!sigdata) goto error;

    if (dumbfile_getnc((char *)sigdata->name, 60, f) < 60 ||
		sigdata->name[59] != 0x1A) goto error_sd;
	sigdata->name[59] = 0;

	flags = dumbfile_getc(f);
	version = dumbfile_getc(f);
	pver = dumbfile_getc(f);
	sigdata->speed = dumbfile_getc(f);
	sigdata->tempo = dumbfile_getc(f);
	sigdata->mixing_volume = dumbfile_getc(f);
	sigdata->n_orders = dumbfile_igetw(f);
	n_orders = dumbfile_igetw(f);
	sigdata->n_patterns = dumbfile_igetw(f);
	sigdata->n_samples = dumbfile_igetw(f);
	sigdata->n_pchannels = dumbfile_igetw(f);
	n_channels = dumbfile_igetw(f);

	if (dumbfile_error(f) ||
		(flags & 1) ||
		(version != 1 && version != 0x10) ||
		(pver) ||
		(sigdata->n_orders <= 0) ||
		(sigdata->n_orders > 255) ||
		(n_orders > 255) ||
		(n_orders < sigdata->n_orders) ||
		(sigdata->n_patterns > 255) ||
		(sigdata->n_samples > 255) ||
		(sigdata->n_pchannels > DUMB_IT_N_CHANNELS) ||
		(sigdata->n_pchannels > n_channels) ||
		(n_channels > DUMB_IT_N_CHANNELS))
		goto error_sd;

	sigdata->flags = IT_STEREO | IT_OLD_EFFECTS | IT_COMPATIBLE_GXX;

	sigdata->global_volume = 128;
	sigdata->pan_separation = 128;

	sigdata->song_message = NULL;
	sigdata->order = NULL;
	sigdata->instrument = NULL;
	sigdata->sample = NULL;
	sigdata->pattern = NULL;
	sigdata->midi = NULL;
	sigdata->checkpoint = NULL;

	sigdata->n_instruments = 0;

	sigdata->restart_position = 0;

	sigdata->order = malloc(sigdata->n_orders);
	if (!sigdata->order) goto error_usd;

	if (sigdata->n_samples) {
		sigdata->sample = malloc(sigdata->n_samples * sizeof(*sigdata->sample));
		if (!sigdata->sample) goto error_usd;
		for (n = 0; n < sigdata->n_samples; n++)
			sigdata->sample[n].data = NULL;
	}

	if (sigdata->n_patterns) {
		sigdata->pattern = malloc(sigdata->n_patterns * sizeof(*sigdata->pattern));
		if (!sigdata->pattern) goto error_usd;
		for (n = 0; n < sigdata->n_patterns; n++)
			sigdata->pattern[n].entry = NULL;
	}

	component = malloc(5 * sizeof(*component));
	if (!component) goto error_usd;

	for (n = 0; n < 5; n++) {
		component[n_components].offset = dumbfile_igetl(f);
		if (component[n_components].offset) {
			component[n_components].type = n;
			n_components++;
		}
	}

	if (!n_components) goto error_fc;

	total_pattern_size = dumbfile_igetl(f);
	if (!total_pattern_size) goto error_fc;

	qsort(component, n_components, sizeof(PSM_COMPONENT), &psm_component_compare);

	memset(sigdata->channel_volume, 64, DUMB_IT_N_CHANNELS);

	for (n = 0; n < DUMB_IT_N_CHANNELS; n += 4) {
		int sep = 32 * dumb_it_default_panning_separation / 100;
		sigdata->channel_pan[n  ] = 32 - sep;
		sigdata->channel_pan[n+1] = 32 + sep;
		sigdata->channel_pan[n+2] = 32 + sep;
		sigdata->channel_pan[n+3] = 32 - sep;
	}

	for (n = 0; n < n_components; n++)
	{
		int o;

        if ( dumbfile_seek(f, component[n].offset, DFS_SEEK_SET) ) goto error_fc;

		switch (component[n].type) {

			case PSM_COMPONENT_ORDERS:
                if (dumbfile_getnc((char *)sigdata->order, sigdata->n_orders, f) < sigdata->n_orders) goto error_fc;
				if (n_orders > sigdata->n_orders)
					if (dumbfile_skip(f, n_orders - sigdata->n_orders))
                        goto error_fc;
                if (dumbfile_igetw(f)) goto error_fc;
				break;

			case PSM_COMPONENT_PANPOS:
                if (dumbfile_getnc((char *)sigdata->channel_pan, sigdata->n_pchannels, f) < sigdata->n_pchannels) goto error_fc;
				for (o = 0; o < sigdata->n_pchannels; o++) {
					sigdata->channel_pan[o] -= (sigdata->channel_pan[o] & 8) >> 3;
					sigdata->channel_pan[o] = ((int)sigdata->channel_pan[o] << 5) / 7;
				}
				break;

			case PSM_COMPONENT_PATTERNS:
                if (it_old_psm_read_patterns(sigdata->pattern, f, sigdata->n_patterns, total_pattern_size, sigdata->n_pchannels)) goto error_fc;
				break;

			case PSM_COMPONENT_SAMPLE_HEADERS:
                if (it_old_psm_read_samples(&sigdata->sample, f, &sigdata->n_samples)) goto error_fc;
				break;

			case PSM_COMPONENT_COMMENTS:
				if (dumbfile_mgetl(f) == DUMB_ID('T','E','X','T')) {
					o = dumbfile_igetw(f);
					if (o > 0) {
						sigdata->song_message = malloc(o + 1);
                        if (dumbfile_getnc((char *)sigdata->song_message, o, f) < o) goto error_fc;
						sigdata->song_message[o] = 0;
					}
				}
				break;
		}
	}

	_dumb_it_fix_invalid_orders(sigdata);

	free(component);

	return sigdata;

error_fc:
	free(component);
error_usd:
	_dumb_it_unload_sigdata(sigdata);
	return NULL;
error_sd:
	free(sigdata);
error:
	return NULL;
}